

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O0

void pbrt::Printf<std::__cxx11::string,std::__cxx11::string&,std::__cxx11::string_const&>
               (char *fmt,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2)

{
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  char *in_RDX;
  string s;
  string local_40 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  
  StringPrintf<std::__cxx11::string,std::__cxx11::string&,std::__cxx11::string_const&>
            (in_RDX,in_RCX,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  __s = (char *)std::__cxx11::string::c_str();
  fputs(__s,_stdout);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void Printf(const char *fmt, Args &&... args) {
    std::string s = StringPrintf(fmt, std::forward<Args>(args)...);
    fputs(s.c_str(), stdout);
}